

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal_cost.cpp
# Opt level: O3

void duckdb_brotli::BrotliEstimateBitCostsForLiterals
               (size_t pos,size_t len,size_t mask,uint8_t *data,size_t *histogram,float *cost)

{
  long *plVar1;
  byte bVar2;
  ulong uVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  byte bVar9;
  ulong *puVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  bool bVar14;
  double dVar15;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  undefined8 uVar21;
  ulong local_a8;
  ulong local_88 [2];
  float *local_78;
  ulong local_70 [5];
  double local_48;
  undefined8 uStack_40;
  
  local_78 = cost;
  iVar4 = BrotliIsMostlyUTF8(data,pos,mask,len,0.75);
  if (iVar4 == 0) {
    local_a8 = 2000;
    if (len < 2000) {
      local_a8 = len;
    }
    switchD_012e3010::default(histogram,0,0x800);
    uVar8 = pos;
    uVar11 = local_a8;
    if (len != 0) {
      do {
        histogram[data[uVar8 & mask]] = histogram[data[uVar8 & mask]] + 1;
        uVar11 = uVar11 - 1;
        uVar8 = uVar8 + 1;
      } while (uVar11 != 0);
      if (len != 0) {
        uVar8 = 2000;
        do {
          if (1999 < uVar8 - 2000) {
            histogram[data[pos - 2000 & mask]] = histogram[data[pos - 2000 & mask]] - 1;
            local_a8 = local_a8 - 1;
          }
          if (uVar8 < len) {
            histogram[data[pos + 2000 & mask]] = histogram[data[pos + 2000 & mask]] + 1;
            local_a8 = local_a8 + 1;
          }
          uVar11 = histogram[data[pos & mask]];
          lVar12 = uVar11 + (uVar11 == 0);
          if (local_a8 < 0x100) {
            dVar20 = (double)(&kBrotliLog2Table)[local_a8];
            uVar21 = 0;
          }
          else {
            auVar18._8_4_ = (int)(local_a8 >> 0x20);
            auVar18._0_8_ = local_a8;
            auVar18._12_4_ = 0x45300000;
            dVar20 = log2((auVar18._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)local_a8) - 4503599627370496.0));
            uVar21 = extraout_XMM0_Qb_00;
          }
          if (uVar11 < 0x100) {
            dVar15 = (double)(&kBrotliLog2Table)[lVar12];
          }
          else {
            auVar19._8_4_ = (int)((ulong)lVar12 >> 0x20);
            auVar19._0_8_ = lVar12;
            auVar19._12_4_ = 0x45300000;
            local_48 = dVar20;
            uStack_40 = uVar21;
            dVar15 = log2((auVar19._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0));
            dVar20 = local_48;
          }
          dVar20 = (dVar20 - dVar15) + 0.029;
          local_78[uVar8 - 2000] =
               (float)(double)(-(ulong)(dVar20 < 1.0) & (ulong)(dVar20 * 0.5 + 0.5) |
                              ~-(ulong)(dVar20 < 1.0) & (ulong)dVar20);
          pos = pos + 1;
          sVar5 = uVar8 - 1999;
          uVar8 = uVar8 + 1;
        } while (sVar5 != len);
      }
    }
  }
  else {
    local_70[1] = 0;
    local_70[0] = 0;
    local_88[0] = 0;
    if (len == 0) {
      switchD_012e3010::default(histogram,0,0x1800);
    }
    else {
      sVar5 = 0;
      bVar9 = 0;
      do {
        bVar2 = data[sVar5 + pos & mask];
        puVar10 = local_70 + 1;
        if ((((char)bVar2 < '\0') && (puVar10 = local_70, bVar2 < 0xc0)) &&
           (puVar10 = local_70 + 1, 0xdf < bVar9)) {
          puVar10 = local_88;
        }
        *puVar10 = *puVar10 + 1;
        sVar5 = sVar5 + 1;
        bVar9 = bVar2;
      } while (len != sVar5);
      uVar8 = (ulong)(0x18 < local_70[0] + local_88[0]);
      sVar5 = 0x1ef;
      if (len < 0x1ef) {
        sVar5 = len;
      }
      local_70[1] = 0;
      local_70[2] = 0;
      local_70[3] = 0;
      switchD_012e3010::default(histogram,0,0x1800);
      uVar7 = 0;
      sVar6 = pos;
      uVar11 = 0;
      do {
        bVar9 = data[sVar6 & mask];
        histogram[(ulong)bVar9 + uVar7 * 0x100] = histogram[(ulong)bVar9 + uVar7 * 0x100] + 1;
        local_70[uVar7 + 1] = local_70[uVar7 + 1] + 1;
        if ((char)bVar9 < '\0') {
          uVar7 = uVar8;
          if ((bVar9 < 0xc0) && (uVar11 < 0xe0)) {
            uVar7 = 0;
          }
        }
        else {
          uVar7 = 0;
        }
        sVar6 = sVar6 + 1;
        sVar5 = sVar5 - 1;
        uVar11 = (ulong)bVar9;
      } while (sVar5 != 0);
      lVar12 = 2000;
      uVar11 = 0;
      do {
        if (0x1ee < uVar11) {
          if (uVar11 == 0x1ef) {
LAB_01d4739d:
            uVar7 = 0;
          }
          else {
            bVar14 = true;
            if (0x1f0 < uVar11) {
              bVar14 = data[(uVar11 - 0x1f1) + pos & mask] < 0xe0;
            }
            if (-1 < (char)data[(uVar11 - 0x1f0) + pos & mask]) goto LAB_01d4739d;
            uVar7 = uVar8;
            if (bVar14) {
              uVar7 = 0;
            }
            if (0xbf < data[(uVar11 - 0x1f0) + pos & mask]) {
              uVar7 = uVar8;
            }
          }
          plVar1 = (long *)((long)histogram +
                           (ulong)((int)uVar7 * 0x800 +
                                  (uint)data[(uVar11 - 0x1ef) + pos & mask] * 8));
          *plVar1 = *plVar1 + -1;
          local_70[uVar7 + 1] = local_70[uVar7 + 1] - 1;
        }
        if (uVar11 + 0x1ef < len) {
          if ((char)data[uVar11 + 0x1ee + pos & mask] < '\0') {
            uVar7 = uVar8;
            if ((data[uVar11 + 0x1ee + pos & mask] < 0xc0) &&
               (data[uVar11 + 0x1ed + pos & mask] < 0xe0)) {
              uVar7 = 0;
            }
          }
          else {
            uVar7 = 0;
          }
          plVar1 = (long *)((long)histogram +
                           (ulong)((int)uVar7 * 0x800 + (uint)data[uVar11 + 0x1ef + pos & mask] * 8)
                           );
          *plVar1 = *plVar1 + 1;
          local_70[uVar7 + 1] = local_70[uVar7 + 1] + 1;
        }
        if (uVar11 == 0) {
LAB_01d4746f:
          uVar7 = 0;
        }
        else {
          bVar14 = true;
          if (uVar11 != 1) {
            bVar14 = data[(uVar11 - 2) + pos & mask] < 0xe0;
          }
          if (-1 < (char)data[(uVar11 - 1) + pos & mask]) goto LAB_01d4746f;
          uVar7 = uVar8;
          if (bVar14) {
            uVar7 = 0;
          }
          if (0xbf < data[(uVar11 - 1) + pos & mask]) {
            uVar7 = uVar8;
          }
        }
        uVar3 = *(ulong *)((long)histogram +
                          (ulong)((int)uVar7 * 0x800 + (uint)data[pos + uVar11 & mask] * 8));
        lVar13 = uVar3 + (uVar3 == 0);
        uVar7 = local_70[uVar7 + 1];
        if (uVar7 < 0x100) {
          dVar20 = (double)(&kBrotliLog2Table)[uVar7];
          uVar21 = 0;
        }
        else {
          auVar16._8_4_ = (int)(uVar7 >> 0x20);
          auVar16._0_8_ = uVar7;
          auVar16._12_4_ = 0x45300000;
          dVar20 = log2((auVar16._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0));
          uVar21 = extraout_XMM0_Qb;
        }
        if (uVar3 < 0x100) {
          dVar15 = (double)(&kBrotliLog2Table)[lVar13];
        }
        else {
          auVar17._8_4_ = (int)((ulong)lVar13 >> 0x20);
          auVar17._0_8_ = lVar13;
          auVar17._12_4_ = 0x45300000;
          local_48 = dVar20;
          uStack_40 = uVar21;
          dVar15 = log2((auVar17._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0));
          dVar20 = local_48;
        }
        dVar20 = (dVar20 - dVar15) + 0.02905;
        dVar20 = (double)(-(ulong)(dVar20 < 1.0) & (ulong)(dVar20 * 0.5 + 0.5) |
                         ~-(ulong)(dVar20 < 1.0) & (ulong)dVar20);
        if (uVar11 < 2000) {
          dVar20 = dVar20 + ((double)lVar12 / -2000.0) * 0.35 + 0.7;
        }
        local_78[uVar11] = (float)dVar20;
        uVar11 = uVar11 + 1;
        lVar12 = lVar12 + -1;
      } while (len != uVar11);
    }
  }
  return;
}

Assistant:

void duckdb_brotli::BrotliEstimateBitCostsForLiterals(size_t pos, size_t len, size_t mask,
                                       const uint8_t* data,
                                       size_t* histogram, float* cost) {
  if (BrotliIsMostlyUTF8(data, pos, mask, len, kMinUTF8Ratio)) {
    EstimateBitCostsForLiteralsUTF8(pos, len, mask, data, histogram, cost);
    return;
  } else {
    size_t window_half = 2000;
    size_t in_window = BROTLI_MIN(size_t, window_half, len);
    size_t i;
    memset(histogram, 0, 256 * sizeof(histogram[0]));

    /* Bootstrap histogram. */
    for (i = 0; i < in_window; ++i) {
      ++histogram[data[(pos + i) & mask]];
    }

    /* Compute bit costs with sliding window. */
    for (i = 0; i < len; ++i) {
      size_t histo;
      if (i >= window_half) {
        /* Remove a byte in the past. */
        --histogram[data[(pos + i - window_half) & mask]];
        --in_window;
      }
      if (i + window_half < len) {
        /* Add a byte in the future. */
        ++histogram[data[(pos + i + window_half) & mask]];
        ++in_window;
      }
      histo = histogram[data[(pos + i) & mask]];
      if (histo == 0) {
        histo = 1;
      }
      {
        double lit_cost = FastLog2(in_window) - FastLog2(histo);
        lit_cost += 0.029;
        if (lit_cost < 1.0) {
          lit_cost *= 0.5;
          lit_cost += 0.5;
        }
        cost[i] = (float)lit_cost;
      }
    }
  }
}